

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionID.h
# Opt level: O2

istream * FIX::operator>>(istream *stream,SessionID *sessionID)

{
  string str;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  local_30._M_string_length = 0;
  local_30.field_2._M_local_buf[0] = '\0';
  std::operator>>(stream,(string *)&local_30);
  SessionID::fromString(sessionID,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return stream;
}

Assistant:

inline std::istream &operator>>(std::istream &stream, SessionID &sessionID) {
  std::string str;
  stream >> str;
  sessionID.fromString(str);
  return stream;
}